

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O2

void test40(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_data p_Var1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  iVar2 = qpdf_read(qpdf,infile,password);
  if (iVar2 == 0) {
    uVar3 = qpdf_oh_new_stream(qpdf);
    p_Var1 = qpdf;
    uVar4 = qpdf_oh_new_null(qpdf);
    uVar5 = qpdf_oh_new_null(qpdf);
    qpdf_oh_replace_stream_data(p_Var1,uVar3,"12345",0xb,uVar4,uVar5);
    uVar4 = qpdf_get_root(qpdf);
    qpdf_oh_replace_key(qpdf,uVar4,"/Potato",uVar3);
    qpdf_init_write(qpdf,outfile);
    qpdf_set_static_ID(qpdf,1);
    qpdf_set_qdf_mode(qpdf,1);
    qpdf_set_suppress_original_object_IDs(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    return;
  }
  __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x4c5,"void test40(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test40(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test expects minimal.pdf. */

    /* New stream */

    assert(qpdf_read(qpdf, infile, password) == 0);
    qpdf_oh stream = qpdf_oh_new_stream(qpdf);
    qpdf_oh_replace_stream_data(
        qpdf,
        stream,
        (unsigned char*)"12345\000abcde",
        11, /* embedded null */
        qpdf_oh_new_null(qpdf),
        qpdf_oh_new_null(qpdf));
    qpdf_oh root = qpdf_get_root(qpdf);
    qpdf_oh_replace_key(qpdf, root, "/Potato", stream);

    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_qdf_mode(qpdf, QPDF_TRUE);
    qpdf_set_suppress_original_object_IDs(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}